

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O1

int detect_form(archive_read *a,int *is_form_d)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  byte *b;
  size_t sVar9;
  void *pvVar10;
  ulong uVar11;
  size_t sVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte *pbVar15;
  int iVar16;
  ulong uVar17;
  long len;
  ssize_t sVar18;
  byte *p;
  size_t sVar19;
  size_t unaff_R13;
  ssize_t avail;
  ssize_t nl;
  size_t local_58;
  int local_50;
  int local_4c;
  ulong local_48;
  archive_read *local_40;
  int *local_38;
  
  if (is_form_d != (int *)0x0) {
    *is_form_d = 0;
  }
  local_40 = a;
  b = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_58);
  if (b == (byte *)0x0) {
    return -1;
  }
  iVar16 = 0;
  local_50 = 0;
  local_4c = 0;
  sVar19 = local_58;
  local_38 = is_form_d;
LAB_004047b5:
  do {
    if (local_58 == 0) {
      local_48 = 0;
      sVar9 = 0;
    }
    else {
      sVar9 = get_line_size((char *)b,local_58,(ssize_t *)&local_48);
    }
    bVar3 = false;
    sVar12 = sVar19;
    do {
      sVar4 = local_58;
      sVar19 = sVar12;
      sVar5 = sVar9;
      if (((local_48 != 0) || (sVar9 != local_58)) || (bVar3)) break;
      if ((long)sVar9 < 0x100000) {
        uVar17 = (ulong)((int)sVar12 + 0x3ffU & 0xfffffc00);
        pvVar10 = __archive_read_ahead
                            (local_40,uVar17 << (uVar17 < sVar12 + 0xa0),(ssize_t *)&local_58);
        if (pvVar10 == (void *)0x0) {
          if ((long)local_58 <= (long)sVar12) {
            unaff_R13 = 0;
            b = (byte *)0x0;
            goto LAB_00404812;
          }
          pvVar10 = __archive_read_ahead(local_40,local_58,(ssize_t *)&local_58);
          bVar3 = true;
        }
        sVar19 = local_58;
        b = (byte *)((long)pvVar10 + (sVar12 - sVar4));
        local_58 = local_58 - (sVar12 - sVar4);
        sVar18 = get_line_size((char *)(b + sVar9),local_58 - sVar9,(ssize_t *)&local_48);
        sVar12 = 0;
        if (-1 < sVar18) {
          sVar12 = sVar9;
        }
        sVar9 = sVar12 + sVar18;
        bVar2 = true;
      }
      else {
        unaff_R13 = 0xffffffffffffffff;
LAB_00404812:
        bVar2 = false;
      }
      sVar12 = sVar19;
      sVar5 = unaff_R13;
    } while (bVar2);
    unaff_R13 = sVar5;
    uVar17 = local_48;
    iVar6 = local_50;
    if (((long)unaff_R13 < 1) || (local_48 == 0)) goto LAB_00404c65;
    if (local_50 == 0) {
      bVar3 = 0 < (long)unaff_R13;
      if (0 < (long)unaff_R13) {
        pbVar15 = b + unaff_R13;
        do {
          sVar9 = local_58 - 1;
          if ((*b != 0x20) && (*b != 9)) goto LAB_0040492a;
          b = b + 1;
          bVar3 = 1 < (long)unaff_R13;
          bVar2 = 1 < (long)unaff_R13;
          unaff_R13 = unaff_R13 - 1;
          local_58 = sVar9;
        } while (bVar2);
        unaff_R13 = 0;
        b = pbVar15;
      }
LAB_0040492a:
      bVar1 = *b;
      if (bVar1 < 0x23) {
        if ((bVar1 == 10) || (bVar1 == 0xd)) {
LAB_00404946:
          b = b + unaff_R13;
          local_58 = local_58 - unaff_R13;
          goto LAB_004047b5;
        }
LAB_00404a49:
        pbVar15 = b + unaff_R13;
        iVar6 = 0;
        bVar2 = false;
        p = b;
        if (bVar3) {
          uVar11 = (ulong)*b;
          if (bid_entry_safe_char[uVar11] == '\0') {
            bVar2 = false;
          }
          else {
            do {
              p = p + 1;
              if (pbVar15 <= p) {
                bVar2 = true;
                goto LAB_00404ac6;
              }
              uVar11 = (ulong)*p;
            } while (bid_entry_safe_char[uVar11] != '\0');
            bVar2 = true;
          }
          if ((0x20 < (byte)uVar11) || ((0x100002600U >> (uVar11 & 0x3f) & 1) == 0)) {
            bVar2 = false;
          }
        }
LAB_00404ac6:
        sVar18 = (long)pbVar15 - (long)p;
        if (bVar2) {
LAB_00404bc0:
          iVar8 = bid_keyword_list((char *)p,sVar18,0,iVar6);
        }
        else {
          pbVar14 = pbVar15 + -local_48;
          if (((pbVar15 + -local_48 + -2 < b) || (pbVar14[-1] != 0x5c)) ||
             ((bVar1 = pbVar15[-local_48 + -2], bVar1 != 9 && (bVar1 != 0x20)))) {
            pbVar13 = pbVar14 + -1;
            bVar3 = true;
            if (pbVar13 < b) {
              uVar7 = 0;
LAB_00404b19:
              if ((uVar7 == 0) || (bVar3)) goto LAB_00404bb3;
              iVar6 = 0;
              bVar2 = false;
              if (*pbVar14 != 0x2f) {
                sVar18 = unaff_R13 - (uVar7 + local_48);
                bVar2 = true;
                iVar6 = 1;
                p = b;
              }
            }
            else {
              bVar2 = false;
              if (*pbVar13 != 0x5c) {
                uVar7 = 0;
                if (b <= pbVar13) {
                  bVar3 = false;
                  uVar7 = 0;
                  do {
                    bVar1 = *pbVar13;
                    if ((bVar1 == 9) || (bVar1 == 0x20)) break;
                    if (bid_entry_safe_char[bVar1] == '\0') goto LAB_00404bb3;
                    uVar7 = uVar7 + 1;
                    if (bVar1 == 0x2f) {
                      bVar3 = true;
                    }
                    pbVar13 = pbVar13 + -1;
                  } while (b <= pbVar13);
                  pbVar14 = pbVar13 + 1;
                  bVar3 = !bVar3;
                }
                goto LAB_00404b19;
              }
              iVar6 = 0;
            }
          }
          else {
LAB_00404bb3:
            iVar6 = 0;
            bVar2 = false;
          }
          iVar8 = -1;
          if (bVar2) goto LAB_00404bc0;
        }
        if (iVar8 < 0) {
LAB_00404c08:
          bVar3 = false;
        }
        else {
          if (local_4c == 1) {
            local_4c = 1;
            if ((iVar6 == 0) && (iVar8 != 0)) goto LAB_00404c08;
          }
          else if ((local_4c == 0) && (local_4c = 1, iVar6 == 0)) {
            local_4c = -(uint)(iVar8 != 0);
          }
          if ((iVar6 == 0) && (pbVar15[~uVar17] == 0x5c)) {
            bVar3 = true;
            local_50 = 1;
          }
          else {
            bVar3 = iVar16 < 2;
            iVar16 = iVar16 + 1;
          }
        }
        if (!bVar3) goto LAB_00404c65;
      }
      else {
        if (bVar1 == 0x23) goto LAB_00404946;
        if (bVar1 != 0x2f) goto LAB_00404a49;
        if (((long)unaff_R13 < 5) || (iVar6 = strncmp((char *)b,"/set",4), iVar6 != 0)) {
          if (6 < (long)unaff_R13) {
            iVar6 = strncmp((char *)b,"/unset",6);
            if (iVar6 == 0) {
              pbVar15 = b + 6;
              len = unaff_R13 - 6;
              iVar6 = 1;
              goto LAB_00404a05;
            }
LAB_00404c5a:
            unaff_R13 = 1;
          }
LAB_00404c65:
          if (iVar16 < 3) {
            if (unaff_R13 != 0) {
              return 0;
            }
            if (iVar16 < 1) {
              return 0;
            }
          }
          if (local_38 == (int *)0x0) {
            return 0x20;
          }
          if (local_4c != 1) {
            return 0x20;
          }
          *local_38 = 1;
          return 0x20;
        }
        pbVar15 = b + 4;
        len = unaff_R13 - 4;
        iVar6 = 0;
LAB_00404a05:
        iVar6 = bid_keyword_list((char *)pbVar15,len,iVar6,0);
        if (iVar6 < 1) goto LAB_00404c5a;
        if (b[~uVar17 + unaff_R13] == 0x5c) {
          local_50 = 2;
        }
      }
      b = b + unaff_R13;
      local_58 = local_58 - unaff_R13;
      goto LAB_004047b5;
    }
    iVar8 = bid_keyword_list((char *)b,unaff_R13,0,0);
    if (iVar8 < 1) goto LAB_00404c65;
    b = b + unaff_R13;
    local_50 = iVar6;
    if ((b[~uVar17] != 0x5c) && (local_50 = 0, iVar6 == 1)) {
      iVar6 = iVar16 + 1;
      bVar3 = 1 < iVar16;
      iVar16 = iVar6;
      local_50 = 0;
      if (bVar3) goto LAB_00404c65;
    }
    local_58 = local_58 - unaff_R13;
  } while( true );
}

Assistant:

static int
detect_form(struct archive_read *a, int *is_form_d)
{
	const char *p;
	ssize_t avail, ravail;
	ssize_t detected_bytes = 0, len, nl;
	int entry_cnt = 0, multiline = 0;
	int form_D = 0;/* The archive is generated by `NetBSD mtree -D'
			* (In this source we call it `form D') . */

	if (is_form_d != NULL)
		*is_form_d = 0;
	p = __archive_read_ahead(a, 1, &avail);
	if (p == NULL)
		return (-1);
	ravail = avail;
	for (;;) {
		len = next_line(a, &p, &avail, &ravail, &nl);
		/* The terminal character of the line should be
		 * a new line character, '\r\n' or '\n'. */
		if (len <= 0 || nl == 0)
			break;
		if (!multiline) {
			/* Leading whitespace is never significant,
			 * ignore it. */
			while (len > 0 && (*p == ' ' || *p == '\t')) {
				++p;
				--avail;
				--len;
			}
			/* Skip comment or empty line. */ 
			if (p[0] == '#' || p[0] == '\n' || p[0] == '\r') {
				p += len;
				avail -= len;
				continue;
			}
		} else {
			/* A continuance line; the terminal
			 * character of previous line was '\' character. */
			if (bid_keyword_list(p, len, 0, 0) <= 0)
				break;
			if (multiline == 1)
				detected_bytes += len;
			if (p[len-nl-1] != '\\') {
				if (multiline == 1 &&
				    ++entry_cnt >= MAX_BID_ENTRY)
					break;
				multiline = 0;
			}
			p += len;
			avail -= len;
			continue;
		}
		if (p[0] != '/') {
			int last_is_path, keywords;

			keywords = bid_entry(p, len, nl, &last_is_path);
			if (keywords >= 0) {
				detected_bytes += len;
				if (form_D == 0) {
					if (last_is_path)
						form_D = 1;
					else if (keywords > 0)
						/* This line is not `form D'. */
						form_D = -1;
				} else if (form_D == 1) {
					if (!last_is_path && keywords > 0)
						/* This this is not `form D'
						 * and We cannot accept mixed
						 * format. */
						break;
				}
				if (!last_is_path && p[len-nl-1] == '\\')
					/* This line continues. */
					multiline = 1;
				else {
					/* We've got plenty of correct lines
					 * to assume that this file is a mtree
					 * format. */
					if (++entry_cnt >= MAX_BID_ENTRY)
						break;
				}
			} else
				break;
		} else if (len > 4 && strncmp(p, "/set", 4) == 0) {
			if (bid_keyword_list(p+4, len-4, 0, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else if (len > 6 && strncmp(p, "/unset", 6) == 0) {
			if (bid_keyword_list(p+6, len-6, 1, 0) <= 0)
				break;
			/* This line continues. */
			if (p[len-nl-1] == '\\')
				multiline = 2;
		} else
			break;

		/* Test next line. */
		p += len;
		avail -= len;
	}
	if (entry_cnt >= MAX_BID_ENTRY || (entry_cnt > 0 && len == 0)) {
		if (is_form_d != NULL) {
			if (form_D == 1)
				*is_form_d = 1;
		}
		return (32);
	}

	return (0);
}